

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::fix_in_buffer(jpeg_decoder *this)

{
  uint8 uVar1;
  uint8 *puVar2;
  int iVar3;
  
  iVar3 = this->m_bits_left;
  if (iVar3 == 0x10) {
    puVar2 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = puVar2 + -1;
    puVar2[-1] = (uint8)this->m_bit_buf;
    this->m_in_buf_left = this->m_in_buf_left + 1;
    iVar3 = this->m_bits_left;
  }
  if (7 < iVar3) {
    uVar1 = *(uint8 *)((long)&this->m_bit_buf + 1);
    puVar2 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = puVar2 + -1;
    puVar2[-1] = uVar1;
    this->m_in_buf_left = this->m_in_buf_left + 1;
  }
  uVar1 = *(uint8 *)((long)&this->m_bit_buf + 2);
  puVar2 = this->m_pIn_buf_ofs;
  this->m_pIn_buf_ofs = puVar2 + -1;
  puVar2[-1] = uVar1;
  this->m_in_buf_left = this->m_in_buf_left + 1;
  uVar1 = *(uint8 *)((long)&this->m_bit_buf + 3);
  puVar2 = this->m_pIn_buf_ofs;
  this->m_pIn_buf_ofs = puVar2 + -1;
  puVar2[-1] = uVar1;
  this->m_in_buf_left = this->m_in_buf_left + 1;
  this->m_bits_left = 0x10;
  get_bits_no_markers(this,0x10);
  get_bits_no_markers(this,0x10);
  return;
}

Assistant:

void jpeg_decoder::fix_in_buffer() {
  // In case any 0xFF's where pulled into the buffer during marker scanning.
  JPGD_ASSERT((m_bits_left & 7) == 0);

  if (m_bits_left == 16)
    stuff_char((uint8)(m_bit_buf & 0xFF));

  if (m_bits_left >= 8)
    stuff_char((uint8)((m_bit_buf >> 8) & 0xFF));

  stuff_char((uint8)((m_bit_buf >> 16) & 0xFF));
  stuff_char((uint8)((m_bit_buf >> 24) & 0xFF));

  m_bits_left = 16;
  get_bits_no_markers(16);
  get_bits_no_markers(16);
}